

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void CreateSignature(ecs_iter_t *it)

{
  ecs_world_t *world_00;
  ecs_entity_t *peVar1;
  ecs_entity_t entity;
  int32_t iVar2;
  undefined8 *puVar3;
  void *pvVar4;
  int *piVar5;
  ecs_sig_column_t *column;
  ecs_sig_column_t *column_array;
  int column_count;
  int column_i;
  EcsSignature sig;
  char *name;
  ecs_entity_t e;
  int32_t i;
  EcsSignatureExpr *signature;
  ecs_entity_t *entities;
  ecs_world_t *world;
  ecs_iter_t *it_local;
  
  world_00 = it->world;
  peVar1 = it->entities;
  puVar3 = (undefined8 *)ecs_column_w_size(it,8,1);
  for (e._4_4_ = 0; e._4_4_ < it->count; e._4_4_ = e._4_4_ + 1) {
    entity = peVar1[e._4_4_];
    sig.signature.columns = (ecs_vector_t *)ecs_get_name(world_00,entity);
    memset(&column_count,0,0x18);
    ecs_sig_init(world_00,(char *)sig.signature.columns,(char *)*puVar3,(ecs_sig_t *)&column_count);
    ecs_set_ptr_w_entity(world_00,entity,9,0x18,&column_count);
    iVar2 = ecs_vector_count((ecs_vector_t *)sig.signature.expr);
    pvVar4 = _ecs_vector_first((ecs_vector_t *)sig.signature.expr,0x28,0x10);
    for (column_array._4_4_ = 0; column_array._4_4_ < iVar2;
        column_array._4_4_ = column_array._4_4_ + 1) {
      piVar5 = (int *)((long)pvVar4 + (long)column_array._4_4_ * 0x28);
      if (*piVar5 == 4) {
        ecs_add_entity(world_00,entity,*(ecs_entity_t *)(piVar5 + 4));
      }
    }
  }
  return;
}

Assistant:

static
void CreateSignature(
    ecs_iter_t *it) 
{
    ecs_world_t *world = it->world;
    ecs_entity_t *entities = it->entities;

    EcsSignatureExpr *signature = ecs_column(it, EcsSignatureExpr, 1);
    
    int32_t i;
    for (i = 0; i < it->count; i ++) {
        ecs_entity_t e = entities[i];
        const char *name = ecs_get_name(world, e);

        /* Parse the signature and add the result to the entity */
        EcsSignature sig = {0};
        ecs_sig_init(world, name, signature[0].expr, &sig.signature);
        ecs_set_ptr(world, e, EcsSignature, &sig);

        /* If sig has FromSystem columns, add components to the entity */
        ecs_vector_each(sig.signature.columns, ecs_sig_column_t, column, {
            if (column->from_kind == EcsFromSystem) {
                ecs_add_entity(world, e, column->is.component);
            }
        });    
    }
}